

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_right<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,uint32_t right)

{
  uint32_t uVar1;
  int iVar2;
  rrb<int,_false,_6> *prVar3;
  leaf_node<int,_false> *plVar4;
  rrb<int,_false,_6> *prVar5;
  rrb<int,_false,_6> *prVar6;
  uint len;
  uint uVar7;
  ulong uVar8;
  ref<immutable::rrb_details::tree_node<int,_false>_> root;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_48;
  rrb<int,_false,_6> *local_40;
  uint32_t local_34;
  
  if (right == 0) {
    rrb_create<int,false,6>();
  }
  else {
    prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    if (right < prVar3->cnt) {
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      uVar1 = prVar3->cnt;
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      uVar7 = uVar1 - prVar3->tail_len;
      len = right - uVar7;
      if (right < uVar7 || len == 0) {
        rrb_create<int,false,6>();
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
        rrb_drop_right_rec<int,false,6>
                  ((rrb_details *)&local_48,&prVar3->shift,&prVar5->root,right - 1,prVar6->shift,
                   false);
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar3->cnt = right;
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        ref<immutable::rrb_details::tree_node<int,_false>_>::operator=
                  (&prVar3->root,(ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_48);
        promote_rightmost_leaf<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar3->tail);
        uVar1 = plVar4->len;
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar3->tail_len = uVar1;
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_48);
      }
      else {
        prVar3 = rrb_head_clone<int,false,6>(in->ptr);
        *(rrb<int,_false,_6> **)this = prVar3;
        if (prVar3 != (rrb<int,_false,_6> *)0x0) {
          prVar3->_ref_count = 1;
        }
        local_40 = (rrb<int,_false,_6> *)this;
        local_48.ptr = leaf_node_create<int,false>(len);
        if (local_48.ptr != (leaf_node<int,_false> *)0x0) {
          (local_48.ptr)->_ref_count = 1;
        }
        local_34 = len;
        for (uVar8 = 0; this = (rrb_details *)local_40, len != uVar8; uVar8 = uVar8 + 1) {
          prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar3->tail);
          iVar2 = plVar4->child[uVar8];
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&local_48);
          plVar4->child[uVar8] = iVar2;
        }
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)local_40);
        prVar3->cnt = right;
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar3->tail,&local_48);
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar3->tail_len = local_34;
        release<int>(local_48.ptr);
      }
    }
    else {
      prVar3 = in->ptr;
      *(rrb<int,_false,_6> **)this = prVar3;
      if (prVar3 != (rrb<int,_false,_6> *)0x0) {
        prVar3->_ref_count = prVar3->_ref_count + 1;
      }
    }
  }
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_right(ref<rrb<T, atomic_ref_counting, N>> in, const uint32_t right)
      {
      using namespace rrb_details;
      if (right == 0)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (right < in->cnt)
        {
        const uint32_t tail_offset = in->cnt - in->tail_len;
        // Can just cut the tail slightly
        if (tail_offset < right)
          {
          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
          const uint32_t new_tail_len = right - tail_offset;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);
          //memcpy(new_tail->child, in->tail->child, new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          new_rrb->cnt = right;
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<tree_node<T, atomic_ref_counting>> root = rrb_drop_right_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, right - 1, in->shift, false);
        new_rrb->cnt = right;
        new_rrb->root = root;

        // Not sure if this is necessary in this part of the program, due to issues
        // wrt. rrb_drop_left and roots without size tables.
        promote_rightmost_leaf(new_rrb);
        new_rrb->tail_len = new_rrb->tail->len;
        return new_rrb;
        }
      else
        {
        return in;
        }
      }